

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::ParseFromArray
          (ChromeCompositorSchedulerState *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  _Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false> _Var8;
  uint8_t cur_byte_2;
  ulong uVar9;
  uint8_t cur_byte_3;
  ulong *puVar10;
  uint8_t cur_byte;
  ulong uVar11;
  uint8_t cur_byte_1;
  ulong *puVar12;
  Field local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  do {
    if (puVar7 <= raw) goto switchD_0023feab_caseD_3;
    bVar1 = (byte)*raw;
    uVar6 = (ulong)bVar1;
    puVar10 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar6 = (ulong)(bVar1 & 0x7f);
      lVar5 = 7;
      do {
        if ((puVar7 <= puVar10) || (0x38 < lVar5 - 7U)) goto switchD_0023feab_caseD_3;
        uVar4 = *puVar10;
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar6 = uVar6 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar5 & 0x3f);
        lVar5 = lVar5 + 7;
      } while ((char)(byte)uVar4 < '\0');
    }
    uVar4 = uVar6 >> 3;
    if (((uint)uVar4 == 0) || (puVar7 <= puVar10)) goto switchD_0023feab_caseD_3;
    switch((uint)uVar6 & 7) {
    case 0:
      uVar9 = 0;
      uVar11 = 0;
      while( true ) {
        puVar12 = (ulong *)((long)puVar10 + 1);
        uVar9 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar9;
        if (-1 < (char)(byte)*puVar10) break;
        if ((puVar7 <= puVar12) ||
           (bVar2 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar10 = puVar12, bVar2))
        goto switchD_0023feab_caseD_3;
      }
      local_48.int_value_ = uVar9 & 0xffffffff00000000;
      break;
    case 1:
      puVar12 = puVar10 + 1;
      if (puVar7 < puVar12) goto switchD_0023feab_caseD_3;
      uVar9 = *puVar10;
      local_48.int_value_ = uVar9 & 0xffffffff00000000;
      break;
    case 2:
      puVar10 = (ulong *)((long)puVar10 + 1);
      uVar11 = 0;
      uVar9 = 0;
      puVar12 = puVar10;
      while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar9 & 0x3f) | uVar11
            , (char)*(byte *)((long)puVar12 + -1) < '\0') {
        if (puVar7 <= puVar12) goto switchD_0023feab_caseD_3;
        puVar12 = (ulong *)((long)puVar12 + 1);
        puVar10 = (ulong *)((long)puVar10 + 1);
        bVar2 = 0x38 < uVar9;
        uVar9 = uVar9 + 7;
        if (bVar2) goto switchD_0023feab_caseD_3;
      }
      if (uVar11 <= (ulong)((long)puVar7 - (long)puVar10)) {
        local_48.int_value_ = (ulong)puVar10 & 0xffffffff00000000;
        puVar12 = (ulong *)((long)puVar12 + uVar11);
        uVar9 = (ulong)puVar10 & 0xffffffff;
        goto LAB_0023ff87;
      }
    default:
      goto switchD_0023feab_caseD_3;
    case 5:
      puVar12 = (ulong *)((long)puVar10 + 4);
      if (puVar7 < puVar12) goto switchD_0023feab_caseD_3;
      uVar9 = (ulong)(uint)*puVar10;
      local_48.int_value_ = 0;
    }
    uVar11 = 0;
LAB_0023ff87:
    raw = puVar12;
  } while ((0xffff < (uint)uVar4) || (0xfffffff < uVar11));
  local_48.int_value_ = local_48.int_value_ | uVar9 & 0xffffffff;
  uVar9 = uVar4 << 0x20 | uVar11;
  uVar6 = uVar9 | (ulong)((uint)uVar6 & 7) << 0x30;
  local_48.size_ = (uint32_t)uVar11;
  local_48.type_ = (uint8_t)(uVar6 >> 0x30);
  local_48.id_ = (uint16_t)(uVar9 >> 0x20);
  sVar3 = (short)uVar4;
  do {
    if (sVar3 == 0) {
switchD_0023feab_caseD_3:
      return puVar7 == (ulong *)raw;
    }
    if ((ushort)uVar4 < 0x12) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar4 & 0x3f);
    }
    switch((uint)uVar4 & 0xffff) {
    case 1:
      _Var8._M_head_impl =
           (CompositorTimingHistory *)
           (this->state_machine_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
           .super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_false>.
           _M_head_impl;
      goto LAB_002400f5;
    case 2:
      this->observing_begin_frame_source_ = local_48.int_value_ != 0;
      break;
    case 3:
      this->begin_impl_frame_deadline_task_ = local_48.int_value_ != 0;
      break;
    case 4:
      this->pending_begin_frame_task_ = local_48.int_value_ != 0;
      break;
    case 5:
      this->skipped_last_frame_missed_exceeded_deadline_ = local_48.int_value_ != 0;
      break;
    default:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_48,local_38);
      break;
    case 7:
      this->inside_action_ =
           (ChromeCompositorSchedulerState_BeginImplFrameDeadlineMode)local_48.int_value_;
      break;
    case 8:
      this->deadline_mode_ =
           (ChromeCompositorSchedulerState_BeginImplFrameDeadlineMode)local_48.int_value_;
      break;
    case 9:
      this->deadline_us_ = local_48.int_value_;
      break;
    case 10:
      this->deadline_scheduled_at_us_ = local_48.int_value_;
      break;
    case 0xb:
      this->now_us_ = local_48.int_value_;
      break;
    case 0xc:
      this->now_to_deadline_delta_us_ = local_48.int_value_;
      break;
    case 0xd:
      this->now_to_deadline_scheduled_at_delta_us_ = local_48.int_value_;
      break;
    case 0xe:
      _Var8._M_head_impl =
           (CompositorTimingHistory *)
           (this->begin_impl_frame_args_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::BeginImplFrameArgs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
           .super__Head_base<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_false>._M_head_impl;
      goto LAB_002400f5;
    case 0xf:
      _Var8._M_head_impl =
           (CompositorTimingHistory *)
           (this->begin_frame_observer_state_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
           .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>.
           _M_head_impl;
      goto LAB_002400f5;
    case 0x10:
      _Var8._M_head_impl =
           (CompositorTimingHistory *)
           (this->begin_frame_source_state_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameSourceState,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameSourceState_*,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
           .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameSourceState_*,_false>.
           _M_head_impl;
      goto LAB_002400f5;
    case 0x11:
      _Var8._M_head_impl =
           (this->compositor_timing_history_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
           .super__Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false>.
           _M_head_impl;
LAB_002400f5:
      (*((_Var8._M_head_impl)->super_CppMessageObj)._vptr_CppMessageObj[4])
                (_Var8._M_head_impl,local_48.int_value_,uVar6 & 0xffffffff);
    }
    do {
      if (puVar7 <= raw) goto switchD_0023feab_caseD_3;
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(uint)bVar1;
      puVar10 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar6 = (ulong)(bVar1 & 0x7f);
        lVar5 = 7;
        do {
          if ((puVar7 <= puVar10) || (0x38 < lVar5 - 7U)) goto switchD_0023feab_caseD_3;
          uVar4 = *puVar10;
          puVar10 = (ulong *)((long)puVar10 + 1);
          uVar6 = uVar6 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar5 & 0x3f);
          lVar5 = lVar5 + 7;
        } while ((char)(byte)uVar4 < '\0');
      }
      uVar4 = uVar6 >> 3;
      if (((uint)uVar4 == 0) || (puVar7 <= puVar10)) goto switchD_0023feab_caseD_3;
      switch((uint)uVar6 & 7) {
      case 0:
        uVar9 = 0;
        uVar11 = 0;
        while( true ) {
          puVar12 = (ulong *)((long)puVar10 + 1);
          uVar9 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar9;
          if (-1 < (char)(byte)*puVar10) break;
          if ((puVar7 <= puVar12) ||
             (bVar2 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar10 = puVar12, bVar2))
          goto switchD_0023feab_caseD_3;
        }
        local_48.int_value_ = uVar9 & 0xffffffff00000000;
        break;
      case 1:
        puVar12 = puVar10 + 1;
        if (puVar7 < puVar12) goto switchD_0023feab_caseD_3;
        uVar9 = *puVar10;
        local_48.int_value_ = uVar9 & 0xffffffff00000000;
        break;
      case 2:
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar11 = 0;
        uVar9 = 0;
        puVar12 = puVar10;
        while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar9 & 0x3f) |
                        uVar11, (char)*(byte *)((long)puVar12 + -1) < '\0') {
          if (puVar7 <= puVar12) goto switchD_0023feab_caseD_3;
          puVar12 = (ulong *)((long)puVar12 + 1);
          puVar10 = (ulong *)((long)puVar10 + 1);
          bVar2 = 0x38 < uVar9;
          uVar9 = uVar9 + 7;
          if (bVar2) goto switchD_0023feab_caseD_3;
        }
        if (uVar11 <= (ulong)((long)puVar7 - (long)puVar10)) {
          local_48.int_value_ = (ulong)puVar10 & 0xffffffff00000000;
          puVar12 = (ulong *)((long)puVar12 + uVar11);
          uVar9 = (ulong)puVar10 & 0xffffffff;
          goto LAB_002402c7;
        }
      default:
        goto switchD_0023feab_caseD_3;
      case 5:
        puVar12 = (ulong *)((long)puVar10 + 4);
        if (puVar7 < puVar12) goto switchD_0023feab_caseD_3;
        uVar9 = (ulong)(uint)*puVar10;
        local_48.int_value_ = 0;
      }
      uVar11 = 0;
LAB_002402c7:
      raw = puVar12;
    } while ((0xffff < (uint)uVar4) || (0xfffffff < uVar11));
    local_48.int_value_ = local_48.int_value_ | uVar9 & 0xffffffff;
    uVar9 = uVar4 << 0x20 | uVar11;
    uVar6 = uVar9 | (uVar6 & 7) << 0x30;
    local_48.size_ = (uint32_t)uVar11;
    local_48.type_ = (uint8_t)(uVar6 >> 0x30);
    local_48.id_ = (uint16_t)(uVar9 >> 0x20);
    sVar3 = (short)uVar4;
  } while( true );
}

Assistant:

bool ChromeCompositorSchedulerState::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* state_machine */:
        (*state_machine_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* observing_begin_frame_source */:
        field.get(&observing_begin_frame_source_);
        break;
      case 3 /* begin_impl_frame_deadline_task */:
        field.get(&begin_impl_frame_deadline_task_);
        break;
      case 4 /* pending_begin_frame_task */:
        field.get(&pending_begin_frame_task_);
        break;
      case 5 /* skipped_last_frame_missed_exceeded_deadline */:
        field.get(&skipped_last_frame_missed_exceeded_deadline_);
        break;
      case 7 /* inside_action */:
        field.get(&inside_action_);
        break;
      case 8 /* deadline_mode */:
        field.get(&deadline_mode_);
        break;
      case 9 /* deadline_us */:
        field.get(&deadline_us_);
        break;
      case 10 /* deadline_scheduled_at_us */:
        field.get(&deadline_scheduled_at_us_);
        break;
      case 11 /* now_us */:
        field.get(&now_us_);
        break;
      case 12 /* now_to_deadline_delta_us */:
        field.get(&now_to_deadline_delta_us_);
        break;
      case 13 /* now_to_deadline_scheduled_at_delta_us */:
        field.get(&now_to_deadline_scheduled_at_delta_us_);
        break;
      case 14 /* begin_impl_frame_args */:
        (*begin_impl_frame_args_).ParseFromArray(field.data(), field.size());
        break;
      case 15 /* begin_frame_observer_state */:
        (*begin_frame_observer_state_).ParseFromArray(field.data(), field.size());
        break;
      case 16 /* begin_frame_source_state */:
        (*begin_frame_source_state_).ParseFromArray(field.data(), field.size());
        break;
      case 17 /* compositor_timing_history */:
        (*compositor_timing_history_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}